

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.cc
# Opt level: O0

int main(int param_1,char **param_2)

{
  int __n;
  anon_class_1_0_00000001 *f;
  anon_class_1_0_00000001 local_19;
  char **local_18;
  char **param_2_local;
  int param_1_local;
  
  param_2_local._4_4_ = 0;
  local_18 = param_2;
  param_2_local._0_4_ = param_1;
  signal(2,handleExitSignal);
  Server::setPort(&server,0x407);
  f = &local_19;
  Server::onRead<main::__0>(&server,f);
  Server::listen(&server,(int)f,__n);
  return 0;
}

Assistant:

int main( int /* argc */, char** /* argv */ )
{
  signal( SIGINT, handleExitSignal );

  server.setPort( 1031 );

  server.onRead( [&] ( std::weak_ptr<ClientSocket> socket )
  {
    if( auto s = socket.lock() )
    {
      auto data = s->read();
      s->write( data );
    }
  } );

  server.listen();

  return 0;
}